

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O0

char * lstep(re_guts *g,sopno start,sopno stop,char *bef,int ch,char *aft)

{
  char cVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  long i;
  sopno look;
  sopno sStack_50;
  int here;
  sopno pc;
  sop s;
  cset *cs;
  char *aft_local;
  int ch_local;
  char *bef_local;
  sopno stop_local;
  sopno start_local;
  re_guts *g_local;
  
  look._4_4_ = (int)start;
  sStack_50 = start;
  do {
    if (sStack_50 == stop) {
      return aft;
    }
    uVar2 = g->strip[sStack_50];
    uVar3 = (uint)uVar2 & 0x7c000000;
    if (uVar3 == 0x4000000) {
      if (sStack_50 != stop + -1) {
        __assert_fail("pc == stop-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x344,"char *lstep()");
      }
    }
    else if (uVar3 == 0x8000000) {
      if ((0x7f < ch) && (ch == (char)uVar2)) {
        __assert_fail("!NONCHAR(ch) || ch != (char)OPND(s)",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x348,"char *lstep()");
      }
      if (ch == (char)uVar2) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if (uVar3 == 0xc000000) {
      if ((ch == 0x81) || (ch == 0x83)) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if (uVar3 == 0x10000000) {
      if ((ch == 0x82) || (ch == 0x83)) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if (uVar3 == 0x14000000) {
      if (ch < 0x80) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if (uVar3 == 0x18000000) {
      if ((ch < 0x80) &&
         ((g->sets[uVar2 & 0x3ffffff].ptr[ch & 0xff] & g->sets[uVar2 & 0x3ffffff].mask) != 0)) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if ((uVar3 == 0x1c000000) || (uVar3 == 0x20000000)) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
    }
    else if (uVar3 == 0x24000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
    }
    else if (uVar3 == 0x28000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
      cVar1 = aft[(long)look._4_4_ - (uVar2 & 0x3ffffff)];
      lVar4 = (long)look._4_4_ - (uVar2 & 0x3ffffff);
      aft[lVar4] = aft[lVar4] | aft[look._4_4_];
      if ((cVar1 == '\0') && (aft[(long)look._4_4_ - (uVar2 & 0x3ffffff)] != '\0')) {
        sStack_50 = sStack_50 - ((uVar2 & 0x3ffffff) + 1);
        look._4_4_ = (int)sStack_50;
      }
    }
    else if (uVar3 == 0x2c000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
      lVar4 = (long)look._4_4_ + (uVar2 & 0x3ffffff);
      aft[lVar4] = aft[lVar4] | aft[look._4_4_];
    }
    else if (uVar3 == 0x30000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
    }
    else if ((uVar3 == 0x34000000) || (uVar3 == 0x38000000)) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
    }
    else if (uVar3 == 0x3c000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
      if ((g->strip[sStack_50 + (uVar2 & 0x3ffffff)] & 0x7c000000U) != 0x44000000) {
        __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,899,"char *lstep()");
      }
      lVar4 = (long)look._4_4_ + (uVar2 & 0x3ffffff);
      aft[lVar4] = aft[lVar4] | aft[look._4_4_];
    }
    else if (uVar3 == 0x40000000) {
      if (aft[look._4_4_] != '\0') {
        i = 1;
        while (uVar2 = g->strip[sStack_50 + i], (uVar2 & 0x7c000000) != 0x48000000) {
          if ((uVar2 & 0x7c000000) != 0x44000000) {
            __assert_fail("OP(s) == OOR2",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0x38b,"char *lstep()");
          }
          i = (uVar2 & 0x3ffffff) + i;
        }
        aft[look._4_4_ + i] = aft[look._4_4_ + i] | aft[look._4_4_];
      }
    }
    else if (uVar3 == 0x44000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
      if ((g->strip[sStack_50 + (uVar2 & 0x3ffffff)] & 0x7c000000U) != 0x48000000) {
        if ((g->strip[sStack_50 + (uVar2 & 0x3ffffff)] & 0x7c000000U) != 0x44000000) {
          __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0x392,"char *lstep()");
        }
        lVar4 = (long)look._4_4_ + (uVar2 & 0x3ffffff);
        aft[lVar4] = aft[lVar4] | aft[look._4_4_];
      }
    }
    else if (uVar3 == 0x48000000) {
      aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | aft[look._4_4_];
    }
    else if (uVar3 == 0x4c000000) {
      if (ch == 0x85) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if (uVar3 == 0x50000000) {
      if (ch == 0x86) {
        aft[look._4_4_ + 1] = aft[look._4_4_ + 1] | bef[look._4_4_];
      }
    }
    else if (nope == 0) {
      __assert_fail("nope",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0x39a,"char *lstep()");
    }
    sStack_50 = sStack_50 + 1;
    look._4_4_ = look._4_4_ + 1;
  } while( true );
}

Assistant:

static states
step(g, start, stop, bef, ch, aft)
struct re_guts *g;
sopno start;			/* start state within strip */
sopno stop;			/* state after stop state within strip */
states bef;		/* states reachable before */
int ch;				/* character or NONCHAR code */
states aft;		/* states already known reachable after */
{
	cset *cs;
	sop s;
	sopno pc;
	onestate here;		/* note, macros know this name */
	sopno look;
	long i;

	for (pc = start, INIT(here, pc); pc != stop; pc++, INC(here)) {
		s = g->strip[pc];
		switch (OP(s)) {
		case OEND:
			assert(pc == stop-1);
			break;
		case OCHAR:
			/* only characters can match */
			assert(!NONCHAR(ch) || ch != (char)OPND(s));
			if (ch == (char)OPND(s))
				FWD(aft, bef, 1);
			break;
		case OBOL:
			if (ch == BOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OEOL:
			if (ch == EOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OBOW:
			if (ch == BOW)
				FWD(aft, bef, 1);
			break;
		case OEOW:
			if (ch == EOW)
				FWD(aft, bef, 1);
			break;
		case OANY:
			if (!NONCHAR(ch))
				FWD(aft, bef, 1);
			break;
		case OANYOF:
			cs = &g->sets[OPND(s)];
			if (!NONCHAR(ch) && CHIN(cs, ch))
				FWD(aft, bef, 1);
			break;
		case OBACK_:		/* ignored here */
		case O_BACK:
			FWD(aft, aft, 1);
			break;
		case OPLUS_:		/* forward, this is just an empty */
			FWD(aft, aft, 1);
			break;
		case O_PLUS:		/* both forward and back */
			FWD(aft, aft, 1);
			i = ISSETBACK(aft, OPND(s));
			BACK(aft, aft, OPND(s));
			if (!i && ISSETBACK(aft, OPND(s))) {
				/* oho, must reconsider loop body */
				pc -= OPND(s) + 1;
				INIT(here, pc);
			}
			break;
		case OQUEST_:		/* two branches, both forward */
			FWD(aft, aft, 1);
			FWD(aft, aft, OPND(s));
			break;
		case O_QUEST:		/* just an empty */
			FWD(aft, aft, 1);
			break;
		case OLPAREN:		/* not significant here */
		case ORPAREN:
			FWD(aft, aft, 1);
			break;
		case OCH_:		/* mark the first two branches */
			FWD(aft, aft, 1);
			assert(OP(g->strip[pc+OPND(s)]) == OOR2);
			FWD(aft, aft, OPND(s));
			break;
		case OOR1:		/* done a branch, find the O_CH */
			if (ISSTATEIN(aft, here)) {
				for (look = 1;
						OP(s = g->strip[pc+look]) != O_CH;
						look += OPND(s))
					assert(OP(s) == OOR2);
				FWD(aft, aft, look);
			}
			break;
		case OOR2:		/* propagate OCH_'s marking */
			FWD(aft, aft, 1);
			if (OP(g->strip[pc+OPND(s)]) != O_CH) {
				assert(OP(g->strip[pc+OPND(s)]) == OOR2);
				FWD(aft, aft, OPND(s));
			}
			break;
		case O_CH:		/* just empty */
			FWD(aft, aft, 1);
			break;
		default:		/* ooooops... */
			assert(nope);
			break;
		}
	}

	return(aft);
}